

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::do_insert(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           unsigned_long *value,time_point now,time_point expire_time)

{
  long lVar1;
  _List_node_base *p_Var2;
  time_point __offout;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar3;
  unsigned_long element_idx;
  _List_node_base *p_Var4;
  
  __offout.__d.__r = expire_time.__d.__r;
  if ((ulong)((*(long *)(this + 0x40) - *(long *)(this + 0x38) >> 3) * -0x3333333333333333) <=
      *(ulong *)(this + 0x30)) {
    do_prune(this,now);
  }
  p_Var4 = *(_List_node_base **)(*(long *)(this + 0xb8) + 0x10);
  pVar3 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,unsigned_long&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)(this + 0x50),key,&stack0xffffffffffffffc8);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = p_Var4;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  *(long *)(this + 0xb0) = *(long *)(this + 0xb0) + 1;
  lVar1 = *(long *)(this + 0x38);
  *(unsigned_long *)(lVar1 + 0x20 + (long)p_Var4 * 0x28) = *value;
  ((duration *)(lVar1 + (long)p_Var4 * 0x28))->__r = (rep)expire_time.__d.__r;
  *(undefined8 *)(lVar1 + 0x10 + (long)p_Var4 * 0x28) = *(undefined8 *)(this + 0xb8);
  *(undefined8 *)(lVar1 + 0x18 + (long)p_Var4 * 0x28) = *(undefined8 *)(this + 0xa8);
  ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
    *)(lVar1 + 8 + (long)p_Var4 * 0x28))->_M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
       ._M_cur;
  *(undefined8 *)(this + 0xb8) = **(undefined8 **)(this + 0xb8);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),
             (int)*(undefined8 *)(this + 0x88),(__off64_t *)(this + 0x88),
             (int)*(undefined8 *)(lVar1 + 0x10 + (long)p_Var4 * 0x28),(__off64_t *)__offout.__d.__r,
             in_R9,(uint)p_Var4);
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }
        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        m_ttl_list.emplace_back(element_idx);

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = std::prev(m_ttl_list.end());
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }